

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O2

void DecrementSessionCounter(void)

{
  OutputWorker *this;
  Locker locker;
  Locker local_10;
  
  local_10.TheLock = &m_SessionCounterLock;
  std::recursive_mutex::lock(&m_SessionCounterLock.cs);
  m_SessionCounter = m_SessionCounter - 1;
  if (m_SessionCounter == 0) {
    tonk::Firewall_Shutdown();
    StopWLANOptimizerThread();
    this = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Stop(this);
  }
  tonk::Locker::~Locker(&local_10);
  return;
}

Assistant:

TONK_EXPORT void tonk_flush(
    TonkConnection      connection  // Connection to flush
)
{
    Connection* tonkConnection = reinterpret_cast<Connection*>(connection);
    if (!tonkConnection)
    {
        TONK_DEBUG_BREAK(); // Invalid input
        return;
    }

    tonkConnection->tonk_flush();
}